

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

xmlXPathObjectPtr xmlXPathConvertString(xmlXPathObjectPtr val)

{
  xmlChar *pxVar1;
  xmlXPathObjectPtr pxVar2;
  char *cur;
  
  if (val != (xmlXPathObjectPtr)0x0) {
    switch(val->type) {
    case XPATH_NODESET:
    case XPATH_XSLT_TREE:
      pxVar1 = xmlXPathCastNodeSetToString(val->nodesetval);
      break;
    case XPATH_BOOLEAN:
      cur = "true";
      if (val->boolval == 0) {
        cur = "false";
      }
      pxVar1 = xmlStrdup((xmlChar *)cur);
      break;
    case XPATH_NUMBER:
      pxVar1 = xmlXPathCastNumberToString(val->floatval);
      break;
    case XPATH_STRING:
      goto switchD_001bbd15_caseD_4;
    default:
      xmlXPathFreeObject(val);
      goto LAB_001bbd9f;
    }
    xmlXPathFreeObject(val);
    if (pxVar1 != (xmlChar *)0x0) {
      val = (xmlXPathObjectPtr)(*xmlMalloc)(0x48);
      if (val == (xmlXPathObjectPtr)0x0) {
        (*xmlFree)(pxVar1);
        val = (xmlXPathObjectPtr)0x0;
      }
      else {
        *(undefined8 *)val = 0;
        val->nodesetval = (xmlNodeSetPtr)0x0;
        val->stringval = (xmlChar *)0x0;
        val->user = (void *)0x0;
        *(undefined8 *)&val->index = 0;
        val->user2 = (void *)0x0;
        *(undefined8 *)&val->boolval = 0;
        val->floatval = 0.0;
        *(undefined8 *)&val->index2 = 0;
        val->type = XPATH_STRING;
        val->stringval = pxVar1;
      }
switchD_001bbd15_caseD_4:
      return val;
    }
  }
LAB_001bbd9f:
  pxVar2 = xmlXPathNewString("");
  return pxVar2;
}

Assistant:

xmlXPathObjectPtr
xmlXPathConvertString(xmlXPathObjectPtr val) {
    xmlChar *res = NULL;

    if (val == NULL)
	return(xmlXPathNewCString(""));

    switch (val->type) {
    case XPATH_UNDEFINED:
	break;
    case XPATH_NODESET:
    case XPATH_XSLT_TREE:
	res = xmlXPathCastNodeSetToString(val->nodesetval);
	break;
    case XPATH_STRING:
	return(val);
    case XPATH_BOOLEAN:
	res = xmlXPathCastBooleanToString(val->boolval);
	break;
    case XPATH_NUMBER:
	res = xmlXPathCastNumberToString(val->floatval);
	break;
    case XPATH_USERS:
	/* TODO */
	break;
    }
    xmlXPathFreeObject(val);
    if (res == NULL)
	return(xmlXPathNewCString(""));
    return(xmlXPathWrapString(res));
}